

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::Exactly_<char>,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::apply
          (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *this,
          Exactly_<char> *subParser,IteratorInput<char,_const_char_*> *input)

{
  char cVar1;
  char cVar2;
  int iVar3;
  IteratorInput<char,_const_char_*> subInput;
  IteratorInput<char,_const_char_*> local_50;
  
  iVar3 = 0;
  do {
    local_50.best = input->pos;
    local_50.end = input->end;
    if (local_50.best == local_50.end) break;
    cVar1 = *local_50.best;
    cVar2 = subParser->expected;
    local_50.pos = local_50.best;
    if (cVar1 == cVar2) {
      local_50.pos = local_50.best + 1;
      input->pos = local_50.pos;
      iVar3 = iVar3 + 1;
    }
    local_50.parent = input;
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_50);
  } while (cVar1 == cVar2);
  *this = (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>)0x1;
  *(int *)(this + 4) = iVar3;
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }